

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjEncodeYUV(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelSize,
               uchar *dstBuf,int subsamp,int flags)

{
  int iVar1;
  
  iVar1 = getPixelFormat(pixelSize,flags);
  iVar1 = tjEncodeYUV2(handle,srcBuf,width,pitch,height,iVar1,dstBuf,subsamp,flags);
  return iVar1;
}

Assistant:

DLLEXPORT int tjEncodeYUV(tjhandle handle, unsigned char *srcBuf, int width,
                          int pitch, int height, int pixelSize,
                          unsigned char *dstBuf, int subsamp, int flags)
{
  return tjEncodeYUV2(handle, srcBuf, width, pitch, height,
                      getPixelFormat(pixelSize, flags), dstBuf, subsamp,
                      flags);
}